

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O2

XMLNodeAdapter * BSDFData::operator<<(XMLNodeAdapter *node,Layer *layer)

{
  allocator<char> local_59;
  string local_58;
  Child<const_std::optional<BSDFData::Material>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Material",&local_59);
  FileParse::Child<const_std::optional<BSDFData::Material>_>::Child
            (&local_38,&local_58,&layer->material,0);
  FileParse::operator<<(node,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Geometry",&local_59);
  FileParse::Child<const_std::optional<BSDFData::Geometry>_>::Child
            ((Child<const_std::optional<BSDFData::Geometry>_> *)&local_38,&local_58,&layer->geometry
             ,0);
  FileParse::operator<<(node,(Child<const_std::optional<BSDFData::Geometry>_> *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"DataDefinition",&local_59)
  ;
  FileParse::Child<const_std::optional<BSDFData::DataDefinition>_>::Child
            ((Child<const_std::optional<BSDFData::DataDefinition>_> *)&local_38,&local_58,
             &layer->dataDefinition,0);
  FileParse::operator<<(node,(Child<const_std::optional<BSDFData::DataDefinition>_> *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"WavelengthData",&local_59)
  ;
  FileParse::
  Child<const_std::vector<BSDFData::WavelengthData,_std::allocator<BSDFData::WavelengthData>_>_>::
  Child((Child<const_std::vector<BSDFData::WavelengthData,_std::allocator<BSDFData::WavelengthData>_>_>
         *)&local_38,&local_58,&layer->wavelengthData,0);
  FileParse::operator<<
            (node,(Child<const_std::vector<BSDFData::WavelengthData,_std::allocator<BSDFData::WavelengthData>_>_>
                   *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38.nodeNames);
  std::__cxx11::string::~string((string *)&local_58);
  return node;
}

Assistant:

NodeAdapter & operator<<(NodeAdapter & node, const BSDFData::Layer & layer)
    {
        node << FileParse::Child{"Material", layer.material};
        node << FileParse::Child{"Geometry", layer.geometry};
        node << FileParse::Child{"DataDefinition", layer.dataDefinition};
        node << FileParse::Child{"WavelengthData", layer.wavelengthData};

        return node;
    }